

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

LightLeSample * __thiscall
pbrt::DistantLight::SampleLe
          (DistantLight *this,Point2f *u1,Point2f *u2,SampledWavelengths *lambda,Float time)

{
  undefined1 auVar1 [16];
  SampledSpectrum *s;
  long in_RSI;
  LightLeSample *in_RDI;
  ulong uVar12;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  Vector3<float> VVar17;
  Vector3f VVar18;
  Point3<float> PVar19;
  SampledSpectrum SVar20;
  Ray ray;
  Point3f pDisk;
  Point2f cd;
  Frame wFrame;
  Vector3f w;
  Ray *ray_00;
  undefined4 in_stack_fffffffffffffdc8;
  Float time_00;
  LightLeSample *this_00;
  SampledWavelengths *lambda_00;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  float s_00;
  Point2f *in_stack_fffffffffffffdf8;
  Vector3f *in_stack_fffffffffffffe58;
  Frame *in_stack_fffffffffffffe60;
  Vector3<float> *in_stack_fffffffffffffec8;
  Transform *in_stack_fffffffffffffed0;
  undefined1 local_dc [36];
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a4;
  undefined1 local_9c [52];
  Tuple3<pbrt::Vector3,_float> local_68;
  Ray local_54 [2];
  undefined1 auVar13 [56];
  undefined1 extraout_var [56];
  undefined1 auVar16 [56];
  
  s = (SampledSpectrum *)(in_RSI + 0x18);
  ray_00 = local_54;
  time_00 = 0.0;
  auVar13 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  Vector3<float>::Vector3((Vector3<float> *)ray_00,(float)((ulong)s >> 0x20),SUB84(s,0),0.0);
  VVar17 = Transform::operator()(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  local_68.z = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar2._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar2._8_56_ = auVar13;
  local_68._0_8_ = vmovlpd_avx(auVar2._0_16_);
  local_54[0].d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_68._0_8_;
  local_54[0].d.super_Tuple3<pbrt::Vector3,_float>.z = local_68.z;
  VVar17 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  local_9c._44_4_ = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar13;
  local_9c._36_8_ = vmovlpd_avx(auVar3._0_16_);
  this_00 = (LightLeSample *)local_9c;
  local_54[0]._28_8_ = local_9c._36_8_;
  local_54[0].medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits._4_4_ = local_9c._44_4_;
  Frame::FromZ((Vector3f *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  auVar4._0_8_ = SampleUniformDiskConcentric(in_stack_fffffffffffffdf8);
  auVar4._8_56_ = extraout_var;
  local_a4 = vmovlpd_avx(auVar4._0_16_);
  s_00 = *(float *)(in_RSI + 0xd0);
  uVar12 = 0;
  lambda_00 = (SampledWavelengths *)local_dc;
  Vector3<float>::Vector3((Vector3<float> *)ray_00,(float)((ulong)s >> 0x20),SUB84(s,0),0.0);
  VVar18 = Frame::FromLocal(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  local_dc._20_4_ = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13 = (undefined1  [56])0x0;
  auVar1._8_8_ = uVar12;
  auVar1._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar16 = ZEXT856(uVar12);
  local_dc._12_8_ = vmovlpd_avx(auVar1);
  VVar17 = pbrt::operator*(s_00,(Tuple3<pbrt::Vector3,_float> *)lambda_00);
  local_b8 = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar13;
  local_dc._28_8_ = vmovlpd_avx(auVar5._0_16_);
  PVar19 = Point3<float>::operator+
                     ((Point3<float> *)this_00,
                      (Vector3<float> *)CONCAT44(time_00,in_stack_fffffffffffffdc8));
  local_a8 = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
  auVar6._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar6._8_56_ = auVar13;
  local_b0 = vmovlpd_avx(auVar6._0_16_);
  auVar13 = (undefined1  [56])0x0;
  VVar17 = pbrt::operator*(s_00,(Tuple3<pbrt::Vector3,_float> *)lambda_00);
  auVar7._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar13;
  vmovlpd_avx(auVar7._0_16_);
  PVar19 = Point3<float>::operator+
                     ((Point3<float> *)this_00,
                      (Vector3<float> *)CONCAT44(time_00,in_stack_fffffffffffffdc8));
  auVar8._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar13;
  vmovlpd_avx(auVar8._0_16_);
  VVar17 = Tuple3<pbrt::Vector3,_float>::operator-((Tuple3<pbrt::Vector3,_float> *)ray_00);
  auVar9._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar13;
  vmovlpd_avx(auVar9._0_16_);
  MediumHandle::TaggedPointer((MediumHandle *)ray_00,s);
  Ray::Ray((Ray *)CONCAT44(s_00,in_stack_fffffffffffffde0),(Point3f *)lambda_00,(Vector3f *)this_00,
           time_00,(MediumHandle *)ray_00);
  auVar13 = (undefined1  [56])0x0;
  SVar20 = DenselySampledSpectrum::Sample
                     ((DenselySampledSpectrum *)CONCAT44(s_00,in_stack_fffffffffffffde0),lambda_00);
  auVar14._0_8_ = SVar20.values.values._8_8_;
  auVar14._8_56_ = auVar16;
  auVar10._0_8_ = SVar20.values.values._0_8_;
  auVar10._8_56_ = auVar13;
  auVar13 = (undefined1  [56])0x0;
  vmovlpd_avx(auVar10._0_16_);
  vmovlpd_avx(auVar14._0_16_);
  SVar20 = pbrt::operator*((Float)((ulong)ray_00 >> 0x20),s);
  auVar15._0_8_ = SVar20.values.values._8_8_;
  auVar15._8_56_ = auVar16;
  auVar11._0_8_ = SVar20.values.values._0_8_;
  auVar11._8_56_ = auVar13;
  vmovlpd_avx(auVar11._0_16_);
  vmovlpd_avx(auVar15._0_16_);
  LightLeSample::LightLeSample
            (this_00,(SampledSpectrum *)CONCAT44(time_00,in_stack_fffffffffffffdc8),ray_00,
             (Float)((ulong)s >> 0x20),SUB84(s,0));
  return in_RDI;
}

Assistant:

LightLeSample DistantLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                     SampledWavelengths &lambda, Float time) const {
    // Choose point on disk oriented toward infinite light direction
    Vector3f w = Normalize(renderFromLight(Vector3f(0, 0, 1)));
    Frame wFrame = Frame::FromZ(w);
    Point2f cd = SampleUniformDiskConcentric(u1);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));

    // Compute _DistantLight_ light ray
    Ray ray(pDisk + sceneRadius * w, -w, time);

    return LightLeSample(scale * Lemit.Sample(lambda), ray,
                         1 / (Pi * sceneRadius * sceneRadius), 1);
}